

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::InstanceIntersectorK<8>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined4 uVar25;
  ulong uVar26;
  vbool<8> *pvVar27;
  uint uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  ulong uVar33;
  AccelData *pAVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  Primitive *prim;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar57 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  vint4 ai;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  Precalculations pre;
  vbool<8> valid0;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1309;
  AccelData *local_1308;
  RayK<8> *local_1300;
  ulong local_12f8;
  RayK<8> *local_12f0;
  RayQueryContext *local_12e8;
  vbool<8> *local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  undefined1 local_12c0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_12a0;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [48];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [8];
  float fStack_11b8;
  float fStack_11b4;
  undefined1 local_11b0 [8];
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [8];
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [8];
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [16];
  undefined1 local_1150 [8];
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [16];
  undefined1 local_1130 [8];
  float fStack_1128;
  float fStack_1124;
  undefined1 local_1120 [32];
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_fc0;
  ulong local_fa0 [494];
  undefined1 auVar52 [28];
  undefined1 auVar61 [28];
  
  auVar39 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar40 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar70 = vpcmpeqd_avx(auVar39,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar40 = vpackssdw_avx(auVar40,auVar70);
  if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar40 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar40 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar40 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar40 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar40 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar40 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar40 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar40 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar40 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar40[0xf]) {
    return;
  }
  auVar70 = vpacksswb_avx(auVar40,auVar40);
  pAVar34 = This->ptr;
  local_1060 = *(undefined8 *)ray;
  uStack_1058 = *(undefined8 *)(ray + 8);
  uStack_1050 = *(undefined8 *)(ray + 0x10);
  uStack_1048 = *(undefined8 *)(ray + 0x18);
  local_1080 = *(undefined8 *)(ray + 0x20);
  uStack_1078 = *(undefined8 *)(ray + 0x28);
  uStack_1070 = *(undefined8 *)(ray + 0x30);
  uStack_1068 = *(undefined8 *)(ray + 0x38);
  local_10a0 = *(undefined8 *)(ray + 0x40);
  uStack_1098 = *(undefined8 *)(ray + 0x48);
  uStack_1090 = *(undefined8 *)(ray + 0x50);
  uStack_1088 = *(undefined8 *)(ray + 0x58);
  auVar55 = *(undefined1 (*) [32])(ray + 0x80);
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  auVar72._16_4_ = 0x7fffffff;
  auVar72._20_4_ = 0x7fffffff;
  auVar72._24_4_ = 0x7fffffff;
  auVar72._28_4_ = 0x7fffffff;
  auVar53 = vandps_avx(auVar55,auVar72);
  auVar75._8_4_ = 0x219392ef;
  auVar75._0_8_ = 0x219392ef219392ef;
  auVar75._12_4_ = 0x219392ef;
  auVar75._16_4_ = 0x219392ef;
  auVar75._20_4_ = 0x219392ef;
  auVar75._24_4_ = 0x219392ef;
  auVar75._28_4_ = 0x219392ef;
  auVar53 = vcmpps_avx(auVar53,auVar75,1);
  auVar54 = vblendvps_avx(auVar55,auVar75,auVar53);
  auVar53 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar72);
  auVar53 = vcmpps_avx(auVar53,auVar75,1);
  auVar73 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar75,auVar53);
  auVar53 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar72);
  auVar53 = vcmpps_avx(auVar53,auVar75,1);
  auVar53 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar75,auVar53);
  auVar62 = vrcpps_avx(auVar54);
  fVar4 = auVar62._0_4_;
  fVar5 = auVar62._4_4_;
  auVar11._4_4_ = auVar54._4_4_ * fVar5;
  auVar11._0_4_ = auVar54._0_4_ * fVar4;
  fVar6 = auVar62._8_4_;
  auVar11._8_4_ = auVar54._8_4_ * fVar6;
  fVar7 = auVar62._12_4_;
  auVar11._12_4_ = auVar54._12_4_ * fVar7;
  fVar8 = auVar62._16_4_;
  auVar11._16_4_ = auVar54._16_4_ * fVar8;
  fVar9 = auVar62._20_4_;
  auVar11._20_4_ = auVar54._20_4_ * fVar9;
  fVar10 = auVar62._24_4_;
  auVar11._24_4_ = auVar54._24_4_ * fVar10;
  auVar11._28_4_ = auVar54._28_4_;
  auVar77._8_4_ = 0x3f800000;
  auVar77._0_8_ = &DAT_3f8000003f800000;
  auVar77._12_4_ = 0x3f800000;
  auVar77._16_4_ = 0x3f800000;
  auVar77._20_4_ = 0x3f800000;
  auVar77._24_4_ = 0x3f800000;
  auVar77._28_4_ = 0x3f800000;
  auVar54 = vsubps_avx(auVar77,auVar11);
  local_10c0 = fVar4 + fVar4 * auVar54._0_4_;
  fStack_10bc = fVar5 + fVar5 * auVar54._4_4_;
  fStack_10b8 = fVar6 + fVar6 * auVar54._8_4_;
  fStack_10b4 = fVar7 + fVar7 * auVar54._12_4_;
  fStack_10b0 = fVar8 + fVar8 * auVar54._16_4_;
  fStack_10ac = fVar9 + fVar9 * auVar54._20_4_;
  fStack_10a8 = fVar10 + fVar10 * auVar54._24_4_;
  fStack_10a4 = auVar62._28_4_ + auVar54._28_4_;
  auVar54 = vrcpps_avx(auVar73);
  fVar4 = auVar54._0_4_;
  fVar5 = auVar54._4_4_;
  auVar12._4_4_ = auVar73._4_4_ * fVar5;
  auVar12._0_4_ = auVar73._0_4_ * fVar4;
  fVar6 = auVar54._8_4_;
  auVar12._8_4_ = auVar73._8_4_ * fVar6;
  fVar7 = auVar54._12_4_;
  auVar12._12_4_ = auVar73._12_4_ * fVar7;
  fVar8 = auVar54._16_4_;
  auVar12._16_4_ = auVar73._16_4_ * fVar8;
  fVar9 = auVar54._20_4_;
  auVar12._20_4_ = auVar73._20_4_ * fVar9;
  fVar10 = auVar54._24_4_;
  auVar12._24_4_ = auVar73._24_4_ * fVar10;
  auVar12._28_4_ = auVar62._28_4_;
  auVar73 = vsubps_avx(auVar77,auVar12);
  local_10e0 = fVar4 + fVar4 * auVar73._0_4_;
  fStack_10dc = fVar5 + fVar5 * auVar73._4_4_;
  fStack_10d8 = fVar6 + fVar6 * auVar73._8_4_;
  fStack_10d4 = fVar7 + fVar7 * auVar73._12_4_;
  fStack_10d0 = fVar8 + fVar8 * auVar73._16_4_;
  fStack_10cc = fVar9 + fVar9 * auVar73._20_4_;
  fStack_10c8 = fVar10 + fVar10 * auVar73._24_4_;
  fStack_10c4 = auVar54._28_4_ + auVar73._28_4_;
  auVar54 = vrcpps_avx(auVar53);
  fVar4 = auVar54._0_4_;
  fVar5 = auVar54._4_4_;
  auVar73._4_4_ = auVar53._4_4_ * fVar5;
  auVar73._0_4_ = auVar53._0_4_ * fVar4;
  fVar6 = auVar54._8_4_;
  auVar73._8_4_ = auVar53._8_4_ * fVar6;
  fVar7 = auVar54._12_4_;
  auVar73._12_4_ = auVar53._12_4_ * fVar7;
  fVar8 = auVar54._16_4_;
  auVar73._16_4_ = auVar53._16_4_ * fVar8;
  fVar9 = auVar54._20_4_;
  auVar73._20_4_ = auVar53._20_4_ * fVar9;
  fVar10 = auVar54._24_4_;
  auVar73._24_4_ = auVar53._24_4_ * fVar10;
  auVar73._28_4_ = auVar53._28_4_;
  auVar53 = vsubps_avx(auVar77,auVar73);
  local_1100 = fVar4 + fVar4 * auVar53._0_4_;
  fStack_10fc = fVar5 + fVar5 * auVar53._4_4_;
  fStack_10f8 = fVar6 + fVar6 * auVar53._8_4_;
  fStack_10f4 = fVar7 + fVar7 * auVar53._12_4_;
  fStack_10f0 = fVar8 + fVar8 * auVar53._16_4_;
  fStack_10ec = fVar9 + fVar9 * auVar53._20_4_;
  fStack_10e8 = fVar10 + fVar10 * auVar53._24_4_;
  fStack_10e4 = auVar54._28_4_ + auVar53._28_4_;
  auVar53 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_1000 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar53);
  local_1300 = ray + 0x100;
  local_1020 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar53);
  auVar48 = vpmovsxwd_avx(auVar40);
  local_1210 = vpunpckhwd_avx(auVar40,auVar40);
  local_1040 = ZEXT1632(auVar48);
  auVar66._16_16_ = local_1210;
  auVar66._0_16_ = auVar48;
  auVar40 = auVar40 ^ auVar39;
  auVar39 = vpmovsxwd_avx(auVar40);
  auVar40 = vpunpckhwd_avx(auVar40,auVar40);
  auVar80 = ZEXT3264(CONCAT1616(auVar40,auVar39));
  auVar73 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar55 = vcmpps_avx(auVar55,auVar73,1);
  auVar53._8_4_ = 1;
  auVar53._0_8_ = 0x100000001;
  auVar53._12_4_ = 1;
  auVar53._16_4_ = 1;
  auVar53._20_4_ = 1;
  auVar53._24_4_ = 1;
  auVar53._28_4_ = 1;
  auVar55 = vandps_avx(auVar55,auVar53);
  auVar53 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar73,1);
  auVar62._8_4_ = 2;
  auVar62._0_8_ = 0x200000002;
  auVar62._12_4_ = 2;
  auVar62._16_4_ = 2;
  auVar62._20_4_ = 2;
  auVar62._24_4_ = 2;
  auVar62._28_4_ = 2;
  auVar53 = vandps_avx(auVar53,auVar62);
  auVar53 = vorps_avx(auVar53,auVar55);
  auVar54._8_4_ = 4;
  auVar54._0_8_ = 0x400000004;
  auVar54._12_4_ = 4;
  auVar54._16_4_ = 4;
  auVar54._20_4_ = 4;
  auVar54._24_4_ = 4;
  auVar54._28_4_ = 4;
  auVar55 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar73,1);
  auVar55 = vandps_avx(auVar55,auVar54);
  auVar53 = vorps_avx(auVar53,auVar55);
  auVar55 = vcmpps_avx(auVar55,auVar55,0xf);
  local_1240._0_32_ = vblendvps_avx(auVar55,auVar53,auVar66);
  uVar26 = (ulong)(byte)(SUB161(auVar70 >> 7,0) & 1 | (SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                         (SUB161(auVar70 >> 0x17,0) & 1) << 2 | (SUB161(auVar70 >> 0x1f,0) & 1) << 3
                         | (SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                         (SUB161(auVar70 >> 0x2f,0) & 1) << 5 | (SUB161(auVar70 >> 0x37,0) & 1) << 6
                        | SUB161(auVar70 >> 0x3f,0) << 7);
  local_1308 = pAVar34;
  local_12f0 = ray;
  local_12e8 = context;
LAB_003fd2f0:
  puVar29 = local_fa0 + 2;
  lVar2 = 0;
  if (uVar26 != 0) {
    for (; (uVar26 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar25 = *(undefined4 *)(local_1240 + lVar2 * 4);
  auVar39._4_4_ = uVar25;
  auVar39._0_4_ = uVar25;
  auVar39._8_4_ = uVar25;
  auVar39._12_4_ = uVar25;
  auVar40 = vpcmpeqd_avx(auVar39,local_1240._0_16_);
  auVar39 = vpcmpeqd_avx(auVar39,local_1240._16_16_);
  auVar58 = vpackssdw_avx(auVar40,auVar39);
  auVar40 = vpmovsxwd_avx(auVar58);
  auVar39 = vpunpckhwd_avx(auVar58,auVar58);
  local_1280._16_16_ = auVar39;
  local_1280._0_16_ = auVar40;
  auVar18._4_4_ = fStack_10bc;
  auVar18._0_4_ = local_10c0;
  auVar18._8_4_ = fStack_10b8;
  auVar18._12_4_ = fStack_10b4;
  auVar18._16_4_ = fStack_10b0;
  auVar18._20_4_ = fStack_10ac;
  auVar18._24_4_ = fStack_10a8;
  auVar18._28_4_ = fStack_10a4;
  auVar82._8_4_ = 0x7f800000;
  auVar82._0_8_ = 0x7f8000007f800000;
  auVar82._12_4_ = 0x7f800000;
  auVar82._16_4_ = 0x7f800000;
  auVar82._20_4_ = 0x7f800000;
  auVar82._24_4_ = 0x7f800000;
  auVar82._28_4_ = 0x7f800000;
  auVar55 = vblendvps_avx(auVar82,auVar18,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar53 = vminps_avx(auVar55,auVar53);
  auVar17._4_4_ = fStack_10dc;
  auVar17._0_4_ = local_10e0;
  auVar17._8_4_ = fStack_10d8;
  auVar17._12_4_ = fStack_10d4;
  auVar17._16_4_ = fStack_10d0;
  auVar17._20_4_ = fStack_10cc;
  auVar17._24_4_ = fStack_10c8;
  auVar17._28_4_ = fStack_10c4;
  auVar55 = vblendvps_avx(auVar82,auVar17,local_1280);
  auVar40 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar39 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar39 = vunpcklps_avx(auVar40,auVar39);
  auVar16._4_4_ = fStack_10fc;
  auVar16._0_4_ = local_1100;
  auVar16._8_4_ = fStack_10f8;
  auVar16._12_4_ = fStack_10f4;
  auVar16._16_4_ = fStack_10f0;
  auVar16._20_4_ = fStack_10ec;
  auVar16._24_4_ = fStack_10e8;
  auVar16._28_4_ = fStack_10e4;
  auVar55 = vblendvps_avx(auVar82,auVar16,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar40 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar64 = vinsertps_avx(auVar39,auVar40,0x28);
  auVar81._8_4_ = 0xff800000;
  auVar81._0_8_ = 0xff800000ff800000;
  auVar81._12_4_ = 0xff800000;
  auVar81._16_4_ = 0xff800000;
  auVar81._20_4_ = 0xff800000;
  auVar81._24_4_ = 0xff800000;
  auVar81._28_4_ = 0xff800000;
  auVar55 = vblendvps_avx(auVar81,auVar18,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar40 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar55 = vblendvps_avx(auVar81,auVar17,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar39 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar39 = vunpcklps_avx(auVar40,auVar39);
  auVar55 = vblendvps_avx(auVar81,auVar16,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar40 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar49 = vinsertps_avx(auVar39,auVar40,0x28);
  auVar48 = vcmpps_avx(auVar64,_DAT_01feba10,5);
  auVar40 = vblendvps_avx(auVar49,auVar64,auVar48);
  auVar39 = vmovshdup_avx(auVar40);
  local_12c8 = (ulong)(auVar39._0_4_ < 0.0) << 4 | 0x20;
  auVar39 = vshufpd_avx(auVar40,auVar40,1);
  uVar36 = (ulong)(auVar39._0_4_ < 0.0) << 4 | 0x40;
  local_12d0 = local_12c8 ^ 0x10;
  auVar23._8_8_ = uStack_1058;
  auVar23._0_8_ = local_1060;
  auVar23._16_8_ = uStack_1050;
  auVar23._24_8_ = uStack_1048;
  auVar55 = vblendvps_avx(auVar82,auVar23,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar39 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar21._8_8_ = uStack_1078;
  auVar21._0_8_ = local_1080;
  auVar21._16_8_ = uStack_1070;
  auVar21._24_8_ = uStack_1068;
  auVar55 = vblendvps_avx(auVar82,auVar21,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar70 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar19._8_8_ = uStack_1098;
  auVar19._0_8_ = local_10a0;
  auVar19._16_8_ = uStack_1090;
  auVar19._24_8_ = uStack_1088;
  auVar55 = vblendvps_avx(auVar82,auVar19,local_1280);
  auVar70 = vunpcklps_avx(auVar39,auVar70);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar39 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar70 = vinsertps_avx(auVar70,auVar39,0x28);
  auVar55 = vblendvps_avx(auVar81,auVar23,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar39 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar55 = vblendvps_avx(auVar81,auVar21,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar50 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar50 = vunpcklps_avx(auVar39,auVar50);
  auVar55 = vblendvps_avx(auVar81,auVar19,local_1280);
  auVar53 = vshufps_avx(auVar55,auVar55,0xb1);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar39 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar50 = vinsertps_avx(auVar50,auVar39,0x28);
  auVar39 = vblendvps_avx(auVar50,auVar70,auVar48);
  auVar70 = vblendvps_avx(auVar70,auVar50,auVar48);
  local_1260 = vblendvps_avx(auVar81,local_1020,local_1280);
  auVar55 = vshufps_avx(local_1260,local_1260,0xb1);
  auVar55 = vmaxps_avx(local_1260,auVar55);
  auVar53 = vshufpd_avx(auVar55,auVar55,5);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  local_fe0 = vblendvps_avx(auVar82,local_1000,local_1280);
  auVar53 = vshufps_avx(local_fe0,local_fe0,0xb1);
  auVar53 = vminps_avx(local_fe0,auVar53);
  auVar54 = vshufpd_avx(auVar53,auVar53,5);
  auVar53 = vminps_avx(auVar53,auVar54);
  auVar79 = ZEXT1664(auVar53._16_16_);
  auVar50 = vpacksswb_avx(auVar58,auVar58);
  local_fa0[1] = (ulong)(byte)(SUB161(auVar50 >> 7,0) & 1 | (SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar50 >> 0x37,0) & 1) << 6 | SUB161(auVar50 >> 0x3f,0) << 7
                              );
  local_fa0[0] = *(ulong *)&pAVar34[1].bounds.bounds0.lower.field_0;
  local_12f8 = ~local_fa0[1] & uVar26;
  auVar58 = vminps_avx(auVar53._0_16_,auVar53._16_16_);
  auVar50 = vmaxps_avx(auVar55._0_16_,auVar55._16_16_);
  auVar48 = vblendvps_avx(auVar64,auVar49,auVar48);
  auVar64._0_4_ = auVar70._0_4_ * auVar40._0_4_;
  auVar64._4_4_ = auVar70._4_4_ * auVar40._4_4_;
  auVar64._8_4_ = auVar70._8_4_ * auVar40._8_4_;
  auVar64._12_4_ = auVar70._12_4_ * auVar40._12_4_;
  auVar70._0_4_ = auVar39._0_4_ * auVar48._0_4_;
  auVar70._4_4_ = auVar39._4_4_ * auVar48._4_4_;
  auVar70._8_4_ = auVar39._8_4_ * auVar48._8_4_;
  auVar70._12_4_ = auVar39._12_4_ * auVar48._12_4_;
  local_12d8 = (ulong)(auVar40._0_4_ < 0.0) << 4;
  uVar35 = local_12d8 ^ 0x10;
  _local_1130 = vshufps_avx(auVar40,auVar40,0);
  local_1140 = vshufps_avx(auVar64,auVar64,0);
  _local_1150 = vshufps_avx(auVar40,auVar40,0x55);
  local_1160 = vshufps_avx(auVar64,auVar64,0x55);
  _local_1170 = vshufps_avx(auVar40,auVar40,0xaa);
  local_1180 = vshufps_avx(auVar64,auVar64,0xaa);
  _local_1190 = vshufps_avx(auVar48,auVar48,0);
  local_11a0 = vshufps_avx(auVar70,auVar70,0);
  _local_11b0 = vshufps_avx(auVar48,auVar48,0x55);
  _local_11c0 = vshufps_avx(auVar48,auVar48,0xaa);
  local_11d0 = vshufps_avx(auVar70,auVar70,0x55);
  local_11e0 = vshufps_avx(auVar70,auVar70,0xaa);
  local_11f0 = vshufps_avx(auVar58,auVar58,0);
  local_1200 = vshufps_avx(auVar50,auVar50,0);
LAB_003fd71d:
  if (puVar29 != local_fa0) {
    puVar32 = puVar29 + -2;
    local_1120 = auVar80._0_32_;
    uVar25 = vmovmskps_avx(local_1120);
    uVar26 = ~CONCAT44((int)(uVar26 >> 0x20),uVar25) & puVar29[-1];
    if (uVar26 != 0) {
      uVar37 = *puVar32;
      do {
        if ((uVar37 & 8) != 0) {
          if (uVar26 != 0) {
            aVar45._0_8_ = auVar80._0_8_ ^ 0xffffffffffffffff;
            aVar45._8_4_ = auVar80._8_4_ ^ 0xffffffff;
            aVar45._12_4_ = auVar80._12_4_ ^ 0xffffffff;
            aVar45._16_4_ = auVar80._16_4_ ^ 0xffffffff;
            aVar45._20_4_ = auVar80._20_4_ ^ 0xffffffff;
            aVar45._24_4_ = auVar80._24_4_ ^ 0xffffffff;
            aVar45._28_4_ = auVar80._28_4_ ^ 0xffffffff;
            pvVar27 = (vbool<8> *)((ulong)((uint)uVar37 & 0xf) - 8);
            local_12a0 = aVar45;
            if (pvVar27 == (vbool<8> *)0x0) goto LAB_003fdaa0;
            prim = (Primitive *)(uVar37 & 0xfffffffffffffff0);
            local_12c0._0_8_ = 1;
            local_12e0 = pvVar27;
            goto LAB_003fda37;
          }
          break;
        }
        pfVar1 = (float *)(uVar37 + 0x20 + local_12d8);
        auVar40._0_4_ = (float)local_1130._0_4_ * *pfVar1;
        auVar40._4_4_ = (float)local_1130._4_4_ * pfVar1[1];
        auVar40._8_4_ = fStack_1128 * pfVar1[2];
        auVar40._12_4_ = fStack_1124 * pfVar1[3];
        auVar40 = vsubps_avx(auVar40,local_1140);
        pfVar1 = (float *)(uVar37 + 0x20 + local_12c8);
        auVar48._0_4_ = (float)local_1150._0_4_ * *pfVar1;
        auVar48._4_4_ = (float)local_1150._4_4_ * pfVar1[1];
        auVar48._8_4_ = fStack_1148 * pfVar1[2];
        auVar48._12_4_ = fStack_1144 * pfVar1[3];
        auVar39 = vsubps_avx(auVar48,local_1160);
        auVar40 = vpmaxsd_avx(auVar40,auVar39);
        pfVar1 = (float *)(uVar37 + 0x20 + uVar36);
        auVar49._0_4_ = (float)local_1170._0_4_ * *pfVar1;
        auVar49._4_4_ = (float)local_1170._4_4_ * pfVar1[1];
        auVar49._8_4_ = fStack_1168 * pfVar1[2];
        auVar49._12_4_ = fStack_1164 * pfVar1[3];
        auVar39 = vsubps_avx(auVar49,local_1180);
        auVar39 = vpmaxsd_avx(auVar39,local_11f0);
        auVar40 = vpmaxsd_avx(auVar40,auVar39);
        pfVar1 = (float *)(uVar37 + 0x20 + uVar35);
        auVar50._0_4_ = (float)local_1190._0_4_ * *pfVar1;
        auVar50._4_4_ = (float)local_1190._4_4_ * pfVar1[1];
        auVar50._8_4_ = fStack_1188 * pfVar1[2];
        auVar50._12_4_ = fStack_1184 * pfVar1[3];
        auVar39 = vsubps_avx(auVar50,local_11a0);
        pfVar1 = (float *)(uVar37 + 0x20 + local_12d0);
        auVar58._0_4_ = (float)local_11b0._0_4_ * *pfVar1;
        auVar58._4_4_ = (float)local_11b0._4_4_ * pfVar1[1];
        auVar58._8_4_ = fStack_11a8 * pfVar1[2];
        auVar58._12_4_ = fStack_11a4 * pfVar1[3];
        auVar70 = vsubps_avx(auVar58,local_11d0);
        auVar39 = vpminsd_avx(auVar39,auVar70);
        pfVar1 = (float *)(uVar37 + 0x20 + (uVar36 ^ 0x10));
        auVar59._0_4_ = (float)local_11c0._0_4_ * *pfVar1;
        auVar59._4_4_ = (float)local_11c0._4_4_ * pfVar1[1];
        auVar59._8_4_ = fStack_11b8 * pfVar1[2];
        auVar59._12_4_ = fStack_11b4 * pfVar1[3];
        auVar70 = vsubps_avx(auVar59,local_11e0);
        auVar70 = vpminsd_avx(auVar70,local_1200);
        auVar39 = vpminsd_avx(auVar39,auVar70);
        auVar40 = vcmpps_avx(auVar40,auVar39,2);
        uVar28 = vmovmskps_avx(auVar40);
        if (uVar28 == 0) {
          bVar38 = false;
        }
        else {
          uVar33 = (ulong)(uVar28 & 0xff);
          uVar26 = 0;
          uVar30 = 8;
          do {
            lVar2 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            uVar25 = *(undefined4 *)(uVar37 + 0x20 + lVar2 * 4);
            auVar41._4_4_ = uVar25;
            auVar41._0_4_ = uVar25;
            auVar41._8_4_ = uVar25;
            auVar41._12_4_ = uVar25;
            auVar41._16_4_ = uVar25;
            auVar41._20_4_ = uVar25;
            auVar41._24_4_ = uVar25;
            auVar41._28_4_ = uVar25;
            auVar24._8_8_ = uStack_1058;
            auVar24._0_8_ = local_1060;
            auVar24._16_8_ = uStack_1050;
            auVar24._24_8_ = uStack_1048;
            auVar55 = vsubps_avx(auVar41,auVar24);
            auVar78._0_4_ = local_10c0 * auVar55._0_4_;
            auVar78._4_4_ = fStack_10bc * auVar55._4_4_;
            auVar78._8_4_ = fStack_10b8 * auVar55._8_4_;
            auVar78._12_4_ = fStack_10b4 * auVar55._12_4_;
            auVar80._16_4_ = fStack_10b0 * auVar55._16_4_;
            auVar80._0_16_ = auVar78;
            auVar80._20_4_ = fStack_10ac * auVar55._20_4_;
            auVar80._28_36_ = auVar79._28_36_;
            auVar80._24_4_ = fStack_10a8 * auVar55._24_4_;
            local_12c0 = auVar80._0_32_;
            uVar25 = *(undefined4 *)(uVar37 + 0x40 + lVar2 * 4);
            auVar42._4_4_ = uVar25;
            auVar42._0_4_ = uVar25;
            auVar42._8_4_ = uVar25;
            auVar42._12_4_ = uVar25;
            auVar42._16_4_ = uVar25;
            auVar42._20_4_ = uVar25;
            auVar42._24_4_ = uVar25;
            auVar42._28_4_ = uVar25;
            auVar22._8_8_ = uStack_1078;
            auVar22._0_8_ = local_1080;
            auVar22._16_8_ = uStack_1070;
            auVar22._24_8_ = uStack_1068;
            auVar55 = vsubps_avx(auVar42,auVar22);
            auVar60._0_4_ = local_10e0 * auVar55._0_4_;
            auVar60._4_4_ = fStack_10dc * auVar55._4_4_;
            auVar60._8_4_ = fStack_10d8 * auVar55._8_4_;
            auVar60._12_4_ = fStack_10d4 * auVar55._12_4_;
            auVar61._16_4_ = fStack_10d0 * auVar55._16_4_;
            auVar61._0_16_ = auVar60;
            auVar61._20_4_ = fStack_10cc * auVar55._20_4_;
            auVar61._24_4_ = fStack_10c8 * auVar55._24_4_;
            uVar25 = *(undefined4 *)(uVar37 + 0x60 + lVar2 * 4);
            auVar43._4_4_ = uVar25;
            auVar43._0_4_ = uVar25;
            auVar43._8_4_ = uVar25;
            auVar43._12_4_ = uVar25;
            auVar43._16_4_ = uVar25;
            auVar43._20_4_ = uVar25;
            auVar43._24_4_ = uVar25;
            auVar43._28_4_ = uVar25;
            auVar20._8_8_ = uStack_1098;
            auVar20._0_8_ = local_10a0;
            auVar20._16_8_ = uStack_1090;
            auVar20._24_8_ = uStack_1088;
            auVar55 = vsubps_avx(auVar43,auVar20);
            auVar51._0_4_ = local_1100 * auVar55._0_4_;
            auVar51._4_4_ = fStack_10fc * auVar55._4_4_;
            auVar51._8_4_ = fStack_10f8 * auVar55._8_4_;
            auVar51._12_4_ = fStack_10f4 * auVar55._12_4_;
            auVar52._16_4_ = fStack_10f0 * auVar55._16_4_;
            auVar52._0_16_ = auVar51;
            auVar52._20_4_ = fStack_10ec * auVar55._20_4_;
            auVar52._24_4_ = fStack_10e8 * auVar55._24_4_;
            uVar25 = *(undefined4 *)(uVar37 + 0x30 + lVar2 * 4);
            auVar67._4_4_ = uVar25;
            auVar67._0_4_ = uVar25;
            auVar67._8_4_ = uVar25;
            auVar67._12_4_ = uVar25;
            auVar67._16_4_ = uVar25;
            auVar67._20_4_ = uVar25;
            auVar67._24_4_ = uVar25;
            auVar67._28_4_ = uVar25;
            auVar55 = vsubps_avx(auVar67,auVar24);
            auVar71._0_4_ = local_10c0 * auVar55._0_4_;
            auVar71._4_4_ = fStack_10bc * auVar55._4_4_;
            auVar71._8_4_ = fStack_10b8 * auVar55._8_4_;
            auVar71._12_4_ = fStack_10b4 * auVar55._12_4_;
            auVar13._16_4_ = fStack_10b0 * auVar55._16_4_;
            auVar13._0_16_ = auVar71;
            auVar13._20_4_ = fStack_10ac * auVar55._20_4_;
            auVar13._24_4_ = fStack_10a8 * auVar55._24_4_;
            auVar13._28_4_ = (int)((ulong)uStack_1048 >> 0x20);
            uVar25 = *(undefined4 *)(uVar37 + 0x50 + lVar2 * 4);
            auVar68._4_4_ = uVar25;
            auVar68._0_4_ = uVar25;
            auVar68._8_4_ = uVar25;
            auVar68._12_4_ = uVar25;
            auVar68._16_4_ = uVar25;
            auVar68._20_4_ = uVar25;
            auVar68._24_4_ = uVar25;
            auVar68._28_4_ = uVar25;
            auVar55 = vsubps_avx(auVar68,auVar22);
            auVar74._0_4_ = local_10e0 * auVar55._0_4_;
            auVar74._4_4_ = fStack_10dc * auVar55._4_4_;
            auVar74._8_4_ = fStack_10d8 * auVar55._8_4_;
            auVar74._12_4_ = fStack_10d4 * auVar55._12_4_;
            auVar14._16_4_ = fStack_10d0 * auVar55._16_4_;
            auVar14._0_16_ = auVar74;
            auVar14._20_4_ = fStack_10cc * auVar55._20_4_;
            auVar14._24_4_ = fStack_10c8 * auVar55._24_4_;
            auVar14._28_4_ = (int)((ulong)uStack_1068 >> 0x20);
            uVar25 = *(undefined4 *)(uVar37 + 0x70 + lVar2 * 4);
            auVar69._4_4_ = uVar25;
            auVar69._0_4_ = uVar25;
            auVar69._8_4_ = uVar25;
            auVar69._12_4_ = uVar25;
            auVar69._16_4_ = uVar25;
            auVar69._20_4_ = uVar25;
            auVar69._24_4_ = uVar25;
            auVar69._28_4_ = uVar25;
            auVar55 = vsubps_avx(auVar69,auVar20);
            auVar65._0_4_ = local_1100 * auVar55._0_4_;
            auVar65._4_4_ = fStack_10fc * auVar55._4_4_;
            auVar65._8_4_ = fStack_10f8 * auVar55._8_4_;
            auVar65._12_4_ = fStack_10f4 * auVar55._12_4_;
            auVar15._16_4_ = fStack_10f0 * auVar55._16_4_;
            auVar15._0_16_ = auVar65;
            auVar15._20_4_ = fStack_10ec * auVar55._20_4_;
            auVar15._24_4_ = fStack_10e8 * auVar55._24_4_;
            auVar15._28_4_ = auVar55._28_4_;
            auVar40 = vpminsd_avx(auVar78,auVar71);
            auVar39 = vpminsd_avx(auVar80._16_16_,auVar13._16_16_);
            auVar70 = vpminsd_avx(auVar60,auVar74);
            auVar40 = vpmaxsd_avx(auVar40,auVar70);
            auVar48 = auVar14._16_16_;
            auVar79 = ZEXT1664(auVar48);
            auVar63._12_4_ = 0;
            auVar63._0_12_ = auVar61._16_12_;
            auVar70 = vpminsd_avx(auVar63,auVar48);
            auVar39 = vpmaxsd_avx(auVar39,auVar70);
            auVar57._12_4_ = 0;
            auVar57._0_12_ = auVar52._16_12_;
            auVar70 = vpminsd_avx(auVar57,auVar15._16_16_);
            auVar70 = vpmaxsd_avx(auVar70,local_fe0._16_16_);
            auVar39 = vpmaxsd_avx(auVar39,auVar70);
            auVar70 = vpminsd_avx(auVar51,auVar65);
            auVar70 = vpmaxsd_avx(auVar70,local_fe0._0_16_);
            auVar40 = vpmaxsd_avx(auVar40,auVar70);
            auVar76._16_16_ = auVar39;
            auVar76._0_16_ = auVar40;
            auVar40 = vpmaxsd_avx(auVar71,auVar78);
            auVar39 = vpmaxsd_avx(auVar80._16_16_,auVar13._16_16_);
            auVar70 = vpmaxsd_avx(auVar60,auVar74);
            auVar70 = vpminsd_avx(auVar40,auVar70);
            auVar40 = vpmaxsd_avx(auVar63,auVar48);
            auVar48 = vpminsd_avx(auVar39,auVar40);
            auVar40 = vpmaxsd_avx(auVar57,auVar15._16_16_);
            auVar39 = vpmaxsd_avx(auVar51,auVar65);
            auVar40 = vpminsd_avx(auVar40,local_1260._16_16_);
            auVar40 = vpminsd_avx(auVar48,auVar40);
            auVar39 = vpminsd_avx(auVar39,local_1260._0_16_);
            auVar39 = vpminsd_avx(auVar70,auVar39);
            auVar44._16_16_ = auVar40;
            auVar44._0_16_ = auVar39;
            auVar55 = vcmpps_avx(auVar76,auVar44,2);
            uVar31 = uVar30;
            if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0x7f,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0xbf,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar55[0x1f] < '\0') {
              uVar31 = *(ulong *)(uVar37 + lVar2 * 8);
              if (uVar30 != 8) {
                *puVar32 = uVar30;
                puVar32[1] = uVar26;
                puVar32 = puVar32 + 2;
              }
              uVar28 = vmovmskps_avx(auVar55);
              uVar26 = (ulong)uVar28;
            }
            uVar33 = uVar33 & uVar33 - 1;
            uVar30 = uVar31;
          } while (uVar33 != 0);
          bVar38 = uVar31 != 8;
          uVar37 = uVar31;
        }
        auVar80 = ZEXT3264(local_1120);
      } while (bVar38);
    }
    uVar26 = 0;
    puVar29 = puVar32;
    goto LAB_003fdb18;
  }
  goto LAB_003fdb29;
  while( true ) {
    prim = prim + 1;
    pvVar27 = (vbool<8> *)
              ((long)((anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 *)local_12c0._0_8_)->v + 1);
    bVar38 = local_12e0 <= (ulong)local_12c0._0_8_;
    local_12c0._0_8_ = pvVar27;
    if (bVar38) break;
LAB_003fda37:
    auVar79 = ZEXT1664(auVar79._0_16_);
    pvVar27 = InstanceIntersectorK<8>::occluded
                        ((vbool<8> *)&local_fc0.field_1,(vbool<8> *)&local_12a0.field_1,&local_1309,
                         ray,local_12e8,prim);
    aVar3.v = (__m256)vandnps_avx(local_fc0.v,local_12a0.v);
    auVar55 = (undefined1  [32])local_12a0 & ~(undefined1  [32])local_fc0;
    ray = local_12f0;
    aVar45 = local_fc0;
    local_12a0 = aVar3;
    if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar55 >> 0x7f,0) == '\0') &&
          (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar55 >> 0xbf,0) == '\0') &&
        (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar55[0x1f])
    break;
  }
LAB_003fdaa0:
  auVar55 = vcmpps_avx((undefined1  [32])aVar45,(undefined1  [32])aVar45,0xf);
  auVar46._0_4_ = auVar55._0_4_ ^ local_12a0.i[0];
  auVar46._4_4_ = auVar55._4_4_ ^ local_12a0.i[1];
  auVar46._8_4_ = auVar55._8_4_ ^ local_12a0.i[2];
  auVar46._12_4_ = auVar55._12_4_ ^ local_12a0.i[3];
  auVar46._16_4_ = auVar55._16_4_ ^ local_12a0.i[4];
  auVar46._20_4_ = auVar55._20_4_ ^ local_12a0.i[5];
  auVar46._24_4_ = auVar55._24_4_ ^ local_12a0.i[6];
  auVar46._28_4_ = auVar55._28_4_ ^ local_12a0.i[7];
  auVar53 = vorps_avx(local_1120,auVar46);
  auVar80 = ZEXT3264(auVar53);
  auVar55 = vandnps_avx(auVar53,local_1280);
  auVar54 = local_1280 & ~auVar53;
  puVar29 = puVar32;
  pAVar34 = local_1308;
  local_1280 = auVar55;
  if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar54 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar54 >> 0x7f,0) == '\0') &&
        (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar54 >> 0xbf,0) == '\0') &&
      (auVar54 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar54[0x1f]) {
    uVar26 = CONCAT71((int7)((ulong)pvVar27 >> 8),1);
  }
  else {
    auVar55._8_4_ = 0xff800000;
    auVar55._0_8_ = 0xff800000ff800000;
    auVar55._12_4_ = 0xff800000;
    auVar55._16_4_ = 0xff800000;
    auVar55._20_4_ = 0xff800000;
    auVar55._24_4_ = 0xff800000;
    auVar55._28_4_ = 0xff800000;
    local_1260 = vblendvps_avx(local_1260,auVar55,auVar53);
    uVar26 = 0;
  }
LAB_003fdb18:
  if ((char)uVar26 != '\0') goto LAB_003fdb29;
  goto LAB_003fd71d;
LAB_003fdb29:
  uVar26 = local_12f8;
  if (local_12f8 == 0) {
    auVar47._0_16_ = local_1040._0_16_;
    auVar47._16_16_ = local_1210;
    auVar55 = vandps_avx(auVar80._0_32_,auVar47);
    auVar56._8_4_ = 0xff800000;
    auVar56._0_8_ = 0xff800000ff800000;
    auVar56._12_4_ = 0xff800000;
    auVar56._16_4_ = 0xff800000;
    auVar56._20_4_ = 0xff800000;
    auVar56._24_4_ = 0xff800000;
    auVar56._28_4_ = 0xff800000;
    auVar55 = vmaskmovps_avx(auVar55,auVar56);
    *(undefined1 (*) [32])local_1300 = auVar55;
    return;
  }
  goto LAB_003fd2f0;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }